

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O0

QueryResult * __thiscall
DiskTable::get(QueryResult *__return_storage_ptr__,DiskTable *this,longlong key)

{
  bool bVar1;
  pointer pDVar2;
  pointer plVar3;
  pointer pDVar4;
  allocator<char> local_111;
  list<DiskTableNode,_std::allocator<DiskTableNode>_> *local_110;
  _List_node_base *local_108;
  allocator<char> local_f9;
  undefined1 local_f8 [8];
  SSTableDataEntry res_1;
  iterator end;
  iterator cur_node_1;
  allocator<char> local_95 [13];
  undefined1 local_88 [8];
  SSTableDataEntry res;
  reverse_iterator rend;
  reverse_iterator cur_node;
  __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
  local_30;
  iterator level_end;
  iterator cur_level;
  longlong key_local;
  DiskTable *this_local;
  
  level_end = std::
              vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
              ::begin(&this->diskView);
  local_30._M_current =
       (list<DiskTableNode,_std::allocator<DiskTableNode>_> *)
       std::
       vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
       ::end(&this->diskView);
  do {
    bVar1 = __gnu_cxx::operator!=(&level_end,&local_30);
    if (!bVar1) {
      __return_storage_ptr__->success = false;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__return_storage_ptr__->data,"",&local_111);
      std::allocator<char>::~allocator(&local_111);
      return __return_storage_ptr__;
    }
    cur_node.current._M_node =
         (_List_iterator<DiskTableNode>)
         std::
         vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
         ::begin(&this->diskView);
    bVar1 = __gnu_cxx::operator==
                      (&level_end,
                       (__normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
                        *)&cur_node);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
      ::operator->(&level_end);
      std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::rbegin
                ((list<DiskTableNode,_std::allocator<DiskTableNode>_> *)&rend);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
      ::operator->(&level_end);
      std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::rend
                ((list<DiskTableNode,_std::allocator<DiskTableNode>_> *)
                 ((long)&res.value.field_2 + 8));
      while (bVar1 = std::operator!=(&rend,(reverse_iterator<std::_List_iterator<DiskTableNode>_> *)
                                           ((long)&res.value.field_2 + 8)), bVar1) {
        pDVar2 = std::reverse_iterator<std::_List_iterator<DiskTableNode>_>::operator->(&rend);
        bVar1 = DiskTableNode::mightIn(pDVar2,key);
        if (bVar1) {
          pDVar2 = std::reverse_iterator<std::_List_iterator<DiskTableNode>_>::operator->(&rend);
          DiskTableNode::getEntry((SSTableDataEntry *)local_88,pDVar2,key);
          pDVar2 = std::reverse_iterator<std::_List_iterator<DiskTableNode>_>::operator->(&rend);
          bVar1 = DiskTableNode::valid(pDVar2,(SSTableDataEntry *)local_88);
          if (bVar1) {
            if ((local_88[0] & 1U) == 0) {
              __return_storage_ptr__->success = true;
              std::__cxx11::string::string
                        ((string *)&__return_storage_ptr__->data,(string *)&res.value_length);
              bVar1 = true;
            }
            else {
              __return_storage_ptr__->success = false;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&__return_storage_ptr__->data,"",local_95);
              std::allocator<char>::~allocator(local_95);
              bVar1 = true;
            }
          }
          else {
            bVar1 = false;
          }
          SSTableDataEntry::~SSTableDataEntry((SSTableDataEntry *)local_88);
          if (bVar1) {
            return __return_storage_ptr__;
          }
        }
        std::reverse_iterator<std::_List_iterator<DiskTableNode>_>::operator++
                  ((reverse_iterator<std::_List_iterator<DiskTableNode>_> *)&cur_node_1,(int)&rend);
      }
    }
    else {
      plVar3 = __gnu_cxx::
               __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
               ::operator->(&level_end);
      end = std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::begin(plVar3);
      plVar3 = __gnu_cxx::
               __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
               ::operator->(&level_end);
      res_1.value.field_2._8_8_ =
           std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::end(plVar3);
      while (bVar1 = std::operator!=(&end,(_Self *)((long)&res_1.value.field_2 + 8)), bVar1) {
        pDVar4 = std::_List_iterator<DiskTableNode>::operator->(&end);
        bVar1 = DiskTableNode::mightIn(pDVar4,key);
        if (bVar1) {
          pDVar4 = std::_List_iterator<DiskTableNode>::operator->(&end);
          DiskTableNode::getEntry((SSTableDataEntry *)local_f8,pDVar4,key);
          pDVar4 = std::_List_iterator<DiskTableNode>::operator->(&end);
          bVar1 = DiskTableNode::valid(pDVar4,(SSTableDataEntry *)local_f8);
          if (bVar1) {
            if ((local_f8[0] & 1U) == 0) {
              __return_storage_ptr__->success = true;
              std::__cxx11::string::string
                        ((string *)&__return_storage_ptr__->data,(string *)&res_1.value_length);
              bVar1 = true;
            }
            else {
              __return_storage_ptr__->success = false;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&__return_storage_ptr__->data,"",&local_f9);
              std::allocator<char>::~allocator(&local_f9);
              bVar1 = true;
            }
          }
          else {
            bVar1 = false;
          }
          SSTableDataEntry::~SSTableDataEntry((SSTableDataEntry *)local_f8);
          if (bVar1) {
            return __return_storage_ptr__;
          }
        }
        local_108 = (_List_node_base *)std::_List_iterator<DiskTableNode>::operator++(&end,0);
      }
    }
    local_110 = (list<DiskTableNode,_std::allocator<DiskTableNode>_> *)
                __gnu_cxx::
                __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
                ::operator++(&level_end,0);
  } while( true );
}

Assistant:

DiskTable::QueryResult DiskTable::get(long long int key) {
    auto cur_level = diskView.begin();
    auto level_end = diskView.end();
    for (; cur_level != level_end; cur_level++) {
        if (cur_level == diskView.begin()) {
            // To ensure correctness of result, we should lookup one written to disk later first in level 0 (if there are two sstable already).
            auto cur_node = cur_level->rbegin();
            auto rend = cur_level->rend();
            for (; cur_node != rend; cur_node++) {
                if (cur_node->mightIn(key)) {
                    auto res = cur_node->getEntry(key);
                    if (cur_node->valid(res)) {
                        if (res.delete_flag) {
                            // Delete record must leave in disk.
                            // See also comment in DiskTableNode#valid.
                            return {false, ""};
                        }
                        return {true, std::move(res.value)};
                    }
                }
            }
        } else {
            auto cur_node = cur_level->begin();
            auto end = cur_level->end();
            for (; cur_node != end; cur_node++) {
                if (cur_node->mightIn(key)) {
                    auto res = cur_node->getEntry(key);
                    if (cur_node->valid(res)) {
                        if (res.delete_flag) {
                            return {false, ""};
                        }
                        return {true, std::move(res.value)};
                    }
                }
            }
        }
    }
    return {false, ""};
}